

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_collations.cpp
# Opt level: O2

void duckdb::PragmaCollations::RegisterFunction(BuiltinFunctions *set)

{
  allocator local_209;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_208;
  string local_1e8;
  TableFunction local_1c8;
  
  ::std::__cxx11::string::string((string *)&local_1e8,"pragma_collations",&local_209);
  local_208.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1c8,&local_1e8,(vector<duckdb::LogicalType,_true> *)&local_208,
             PragmaCollateFunction,PragmaCollateBind,PragmaCollateInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_1c8);
  TableFunction::~TableFunction(&local_1c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_208);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

void PragmaCollations::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(
	    TableFunction("pragma_collations", {}, PragmaCollateFunction, PragmaCollateBind, PragmaCollateInit));
}